

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# steal_buf.h
# Opt level: O2

int __thiscall
cppcms::util::filterbuf<cppcms::filters::(anonymous_namespace)::urlencode_buf,_128>::release
          (filterbuf<cppcms::filters::(anonymous_namespace)::urlencode_buf,_128> *this)

{
  int in_EAX;
  size_t in_RCX;
  void *in_RDX;
  int in_ESI;
  
  if (this->output_stream_ != (ostream *)0x0) {
    write(this,in_ESI,in_RDX,in_RCX);
    in_EAX = std::ios::rdbuf((streambuf *)
                             (this->output_stream_ +
                             *(long *)(*(long *)this->output_stream_ + -0x18)));
    this->output_ = (streambuf *)0x0;
    this->output_stream_ = (ostream *)0x0;
  }
  return in_EAX;
}

Assistant:

int release()
		{
			int r=0;
			if(output_stream_) {
				if(write()!=0)
					r=-1;
				output_stream_->rdbuf(output_);
				output_=0;
				output_stream_=0;
			}
			return r;
		}